

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stack_info.h
# Opt level: O2

void __thiscall nodecpp::StackInfo::~StackInfo(StackInfo *this)

{
  ~StackInfo(this);
  operator_delete(this,0x40);
  return;
}

Assistant:

virtual ~StackInfo() {}